

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldInterpolatorTests.cpp
# Opt level: O2

void __thiscall
FieldInterpolatorTest_Constructor_Test::TestBody(FieldInterpolatorTest_Constructor_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)3,_double>_> interpolator3;
  Vector3<double> b;
  Vector3<double> e;
  YeeGrid<(pica::Dimension)3,_double> grid3;
  YeeGrid<(pica::Dimension)1,_double> grid;
  YeeGrid<(pica::Dimension)2,_double> grid2;
  PositionType local_4a8;
  IndexType local_484;
  FieldInterpolatorYeeGridCICBase<(pica::Dimension)3,_double> local_478;
  Vector3<double> local_428;
  Vector3<double> local_408;
  undefined1 local_3e8 [24];
  PositionType local_3d0;
  undefined1 local_3c8 [408];
  Grid<(pica::Dimension)1,_double> local_230;
  Grid<(pica::Dimension)2,_double> local_148;
  
  local_3c8._0_8_ = -1.5;
  local_148.exData.size.x = 0;
  local_148.exData.size.y = 0x3fe00000;
  local_478.grid = (GridType *)CONCAT44(local_478.grid._4_4_,10);
  pica::Grid<(pica::Dimension)1,_double>::Grid
            (&local_230,(PositionType *)local_3c8,(PositionType *)&local_148,(IndexType *)&local_478
            );
  auVar2._8_8_ = local_230.origin.x;
  auVar2._0_8_ = 0x3ff0000000000000;
  auVar1._8_8_ = local_230.step.x;
  auVar1._0_8_ = local_230.step.x;
  local_3e8._8_16_ = divpd(auVar2,auVar1);
  local_3d0.x = local_3e8._16_8_ + 0.5;
  local_408.x = 0.0;
  local_408.y = 0.0;
  local_408.z = 0.0;
  local_428.x = 0.0;
  local_428.y = 0.0;
  local_428.z = 0.0;
  local_3e8._0_8_ = &local_230;
  pica::FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_>::get
            ((FieldInterpolatorCIC<pica::YeeGrid<(pica::Dimension)1,_double>_> *)local_3e8,
             (PositionType)0x3ff0000000000000,&local_408,&local_428);
  local_3c8._0_8_ = 1.0;
  local_3c8._8_8_ = 1.0;
  local_478.grid = (GridType *)0x4000000000000000;
  local_478.inverseStep.x = 2.0;
  local_4a8.x = 1.06099789563086e-313;
  pica::Grid<(pica::Dimension)2,_double>::Grid
            (&local_148,(PositionType *)local_3c8,(PositionType *)&local_478,(IndexType *)&local_4a8
            );
  local_478.grid = (GridType *)0x3ff0000000000000;
  local_478.inverseStep.x = 1.0;
  local_478.inverseStep.y = 1.0;
  local_4a8.x = 2.0;
  local_4a8.y = 2.0;
  local_4a8.z = 2.0;
  local_484.x = 3;
  local_484.y = 5;
  local_484.z = 7;
  pica::Grid<(pica::Dimension)3,_double>::Grid
            ((Grid<(pica::Dimension)3,_double> *)local_3c8,(PositionType *)&local_478,&local_4a8,
             &local_484);
  pica::internal::FieldInterpolatorYeeGridCICBase<(pica::Dimension)3,_double>::
  FieldInterpolatorYeeGridCICBase(&local_478,(GridType *)local_3c8);
  pica::Grid<(pica::Dimension)3,_double>::~Grid((Grid<(pica::Dimension)3,_double> *)local_3c8);
  pica::Grid<(pica::Dimension)2,_double>::~Grid(&local_148);
  pica::Grid<(pica::Dimension)1,_double>::~Grid(&local_230);
  return;
}

Assistant:

TEST(FieldInterpolatorTest, Constructor)
{
    double origin = -1.5;
    double step = 0.5;
    int size = 10;
    YeeGrid<One, double> grid(origin, step, size);
    FieldInterpolatorCIC<YeeGrid<One, double> > interpolator(grid);
    Vector3<double> e, b;
    interpolator.get(1.0, e, b);

    YeeGrid<Two, double> grid2(Vector2<double>(1.0, 1.0), Vector2<double>(2.0, 2.0), Vector2<int>(3, 5));
    FieldInterpolatorCIC<YeeGrid<Two, double> > interpolator2(grid2);

    YeeGrid<Three, double> grid3(Vector3<double>(1.0, 1.0, 1.0), Vector3<double>(2.0, 2.0, 2.0), Vector3<int>(3, 5, 7));
    FieldInterpolatorCIC<YeeGrid<Three, double> > interpolator3(grid3);
}